

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateSizeCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
          *arrayIts,string *structName,bool mutualExclusiveLens)

{
  MemberData *pMVar1;
  pointer pcVar2;
  _Bit_type *p_Var3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer p_Var7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type __n;
  pointer p_Var11;
  ulong uVar12;
  size_type sVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string strippedValue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string assertionCheck;
  string strippedValue;
  string throwText;
  string sum;
  string assertionText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
  *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  allocator_type local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong local_b0;
  string *local_a8;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (8 < (ulong)((long)(arrayIts->
                        super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arrayIts->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
    local_1c0 = arrayIts;
    local_a8 = structName;
    if ((generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
         ::throwTextTemplate_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                                     ::throwTextTemplate_abi_cxx11_), iVar5 != 0)) {
      generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
      ::throwTextTemplate_abi_cxx11_._M_dataplus._M_p =
           (pointer)&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                     ::throwTextTemplate_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                  ::throwTextTemplate_abi_cxx11_,
                 "      if ( ${throwCheck} )\n      {\n        throw LogicError( VULKAN_HPP_NAMESPACE_STRING\"::${structName}::${structName}: ${throwCheck}\" );\n      }\n"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                    ::throwTextTemplate_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                           ::throwTextTemplate_abi_cxx11_);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    if (mutualExclusiveLens) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      local_198._M_string_length = 0;
      local_198.field_2._M_allocated_capacity =
           local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
      p_Var7 = (local_1c0->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Var11 = (local_1c0->
                super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var7 == p_Var11) {
        sVar13 = 0xfffffffffffffffd;
      }
      else {
        paVar16 = &local_158.first.field_2;
        do {
          pMVar1 = p_Var7->_M_current;
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"p","");
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          pcVar2 = (pMVar1->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e0,pcVar2,pcVar2 + (pMVar1->name)._M_string_length);
          sVar13 = local_220._M_string_length;
          if ((local_220._M_string_length <= local_1e0._M_string_length) &&
             ((local_220._M_string_length == 0 ||
              (iVar5 = bcmp(local_1e0._M_dataplus._M_p,local_220._M_dataplus._M_p,
                            local_220._M_string_length), iVar5 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_1e0,0,sVar13);
          }
          anon_unknown.dwarf_18c225::startLowerCase(&local_200,&local_1e0);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_200,0,0,"!",1);
          local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
          paVar14 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p == paVar14) {
            local_240.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_240.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          }
          else {
            local_240.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_240._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_240,"_.empty() + ");
          local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
          paVar14 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p == paVar14) {
            local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            local_158.first._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_158.first._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_198,local_158.first._M_dataplus._M_p,local_158.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != paVar16) {
            operator_delete(local_158.first._M_dataplus._M_p,
                            local_158.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = p_Var7 + 1;
        } while (p_Var7 != p_Var11);
        sVar13 = local_198._M_string_length - 3;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&local_198,sVar13,'\0');
      std::operator+(&local_240,"      VULKAN_HPP_ASSERT( ( ",&local_198);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_240," ) <= 1);\n");
      paVar16 = &local_158.first.field_2;
      local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar14 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p == paVar14) {
        local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_158.first._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_158.first._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_178,local_158.first._M_dataplus._M_p,local_158.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != paVar16) {
        operator_delete(local_158.first._M_dataplus._M_p,
                        local_158.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_158,(char (*) [11])"structName",local_a8);
      std::operator+(&local_1e0,"1 < ( ",&local_198);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1e0," )");
      local_200._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar16 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p == paVar16) {
        local_200.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      else {
        local_200.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_200._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_118,(char (*) [11])"throwCheck",&local_200);
      __l_00._M_len = 2;
      __l_00._M_array = &local_158;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_90,__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_220,(allocator_type *)&local_d0);
      replaceWithMap(&local_240,
                     &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                      ::throwTextTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_1b8,local_240._M_dataplus._M_p,local_240._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      lVar15 = -0x80;
      paVar16 = &local_118.second.field_2;
      do {
        if (paVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar16->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar16->_M_allocated_capacity)[-2],
                          paVar16->_M_allocated_capacity + 1);
        }
        if (&paVar16->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar16->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar16->_M_allocated_capacity)[-6],
                          (&paVar16->_M_allocated_capacity)[-4] + 1);
        }
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar16->_M_allocated_capacity + -8);
        lVar15 = lVar15 + 0x40;
      } while (lVar15 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      p_Var7 = (local_1c0->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (8 < (ulong)((long)(local_1c0->
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var7)) {
        paVar16 = &local_158.first.field_2;
        uVar8 = 1;
        uVar12 = 0;
        do {
          local_158.first._M_string_length =
               (size_type)((p_Var7[uVar12]._M_current)->name)._M_dataplus._M_p;
          local_158.first._M_dataplus._M_p =
               (pointer)((p_Var7[uVar12]._M_current)->name)._M_string_length;
          local_b0 = uVar8;
          bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_158,"p");
          if (!bVar4) {
            __assert_fail("arrayIts[first]->name.starts_with( \"p\" )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2abf,
                          "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                         );
          }
          pMVar1 = (local_1c0->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_current;
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          local_a0 = uVar12;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"p","");
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          pcVar2 = (pMVar1->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar2,pcVar2 + (pMVar1->name)._M_string_length);
          sVar13 = local_200._M_string_length;
          __n = local_240._M_string_length;
          if (local_200._M_string_length <= local_240._M_string_length) {
            __n = local_200._M_string_length;
          }
          if ((local_200._M_string_length <= local_240._M_string_length) &&
             ((__n == 0 ||
              (iVar5 = bcmp(local_240._M_dataplus._M_p,local_200._M_dataplus._M_p,__n), iVar5 == 0))
             )) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_240,0,sVar13);
          }
          anon_unknown.dwarf_18c225::startLowerCase(&local_158.first,&local_240);
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_158.first,"_");
          local_198._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
          paVar14 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p == paVar14) {
            local_198.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_198._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != paVar16) {
            operator_delete(local_158.first._M_dataplus._M_p,
                            local_158.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (local_1c0->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          p_Var11 = (local_1c0->
                    super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          uVar8 = local_b0;
          if (local_b0 < (ulong)((long)p_Var11 - (long)p_Var7 >> 3)) {
            do {
              local_158.first._M_string_length =
                   (size_type)((p_Var7[uVar8]._M_current)->name)._M_dataplus._M_p;
              local_158.first._M_dataplus._M_p =
                   (pointer)((p_Var7[uVar8]._M_current)->name)._M_string_length;
              bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_158,"p")
              ;
              if (!bVar4) {
                __assert_fail("arrayIts[second]->name.starts_with( \"p\" )",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x2ac3,
                              "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                             );
              }
              pMVar1 = (local_1c0->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_current;
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"p","");
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              pcVar2 = (pMVar1->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_200,pcVar2,pcVar2 + (pMVar1->name)._M_string_length);
              sVar13 = local_1e0._M_string_length;
              if ((local_1e0._M_string_length <= local_200._M_string_length) &&
                 ((local_1e0._M_string_length == 0 ||
                  (iVar5 = bcmp(local_200._M_dataplus._M_p,local_1e0._M_dataplus._M_p,
                                local_1e0._M_string_length), iVar5 == 0)))) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(&local_200,0,sVar13);
              }
              anon_unknown.dwarf_18c225::startLowerCase(&local_158.first,&local_200);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_158.first,"_");
              paVar14 = &local_220.field_2;
              local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar6->_M_dataplus)._M_p;
              paVar9 = &pbVar6->field_2;
              if (paVar10 == paVar9) {
                local_240.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_240.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_240.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_240._M_dataplus._M_p = (pointer)paVar10;
              }
              local_240._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p != paVar16) {
                operator_delete(local_158.first._M_dataplus._M_p,
                                local_158.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e0,local_198._M_dataplus._M_p,
                         local_198._M_dataplus._M_p + local_198._M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1e0,".size() == ");
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1e0,local_240._M_dataplus._M_p,local_240._M_string_length);
              local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar10 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p == paVar10) {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_158.first._M_dataplus._M_p = (pointer)paVar16;
              }
              else {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              }
              local_158.first._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_158.first,".size()");
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar6->_M_dataplus)._M_p;
              paVar9 = &pbVar6->field_2;
              if (paVar10 == paVar9) {
                local_200.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_200.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_200._M_dataplus._M_p = (pointer)paVar10;
              }
              local_200._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p != paVar16) {
                operator_delete(local_158.first._M_dataplus._M_p,
                                local_158.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              local_220._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,local_198._M_dataplus._M_p,
                         local_198._M_dataplus._M_p + local_198._M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_220,".size() != ");
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
              local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar10 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p == paVar10) {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_158.first._M_dataplus._M_p = (pointer)paVar16;
              }
              else {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              }
              local_158.first._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_158.first,".size()");
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar6->_M_dataplus)._M_p;
              paVar9 = &pbVar6->field_2;
              if (paVar10 == paVar9) {
                local_1e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
              }
              else {
                local_1e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_1e0._M_dataplus._M_p = (pointer)paVar10;
              }
              local_1e0._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p != paVar16) {
                operator_delete(local_158.first._M_dataplus._M_p,
                                local_158.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar14) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              p_Var7 = (local_1c0->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar1 = p_Var7[local_a0]._M_current;
              p_Var3 = *(_Bit_type **)
                        &(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data;
              if (((p_Var3 == (((_Bit_iterator *)
                               ((long)&(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>
                                       ._M_impl + 0x10))->super__Bit_iterator_base)._M_p) &&
                  (*(uint *)((long)&(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl + 0x18) == 0)) || ((*p_Var3 & 1) == 0)) {
                pMVar1 = p_Var7[uVar8]._M_current;
                p_Var3 = *(_Bit_type **)
                          &(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var3 != (((_Bit_iterator *)
                                 ((long)&(pMVar1->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0))
                goto LAB_00199220;
              }
              else {
LAB_00199220:
                std::operator+(&local_220,"( ",&local_200);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_220," )");
                local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar10 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158.first._M_dataplus._M_p == paVar10) {
                  local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_158.first._M_dataplus._M_p = (pointer)paVar16;
                }
                else {
                  local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                }
                local_158.first._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_200,&local_158.first);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158.first._M_dataplus._M_p != paVar16) {
                  operator_delete(local_158.first._M_dataplus._M_p,
                                  local_158.first.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != paVar14) {
                  operator_delete(local_220._M_dataplus._M_p,
                                  local_220.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_220,"( ",&local_1e0);
                pbVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_220," )");
                local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                paVar10 = &pbVar6->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158.first._M_dataplus._M_p == paVar10) {
                  local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                  local_158.first._M_dataplus._M_p = (pointer)paVar16;
                }
                else {
                  local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                }
                local_158.first._M_string_length = pbVar6->_M_string_length;
                (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar6->_M_string_length = 0;
                (pbVar6->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_1e0,&local_158.first);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158.first._M_dataplus._M_p != paVar16) {
                  operator_delete(local_158.first._M_dataplus._M_p,
                                  local_158.first.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != paVar14) {
                  operator_delete(local_220._M_dataplus._M_p,
                                  local_220.field_2._M_allocated_capacity + 1);
                }
                p_Var7 = (local_1c0->
                         super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pMVar1 = p_Var7[uVar8]._M_current;
                p_Var3 = *(_Bit_type **)
                          &(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var3 != (((_Bit_iterator *)
                                 ((long)&(pMVar1->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0)) {
                  local_220._M_dataplus._M_p = (pointer)paVar14;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,local_240._M_dataplus._M_p,
                             local_240._M_dataplus._M_p + local_240._M_string_length);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_220,".empty() || ");
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_220,local_200._M_dataplus._M_p,
                                     local_200._M_string_length);
                  local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p == paVar10) {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_158.first._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_158.first._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_200,&local_158.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p != paVar16) {
                    operator_delete(local_158.first._M_dataplus._M_p,
                                    local_158.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != paVar14) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_d0,"!",&local_240);
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_d0,".empty() && ");
                  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p == paVar10) {
                    local_220.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_220._M_dataplus._M_p = (pointer)paVar14;
                  }
                  else {
                    local_220.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_220._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_220,local_1e0._M_dataplus._M_p,
                                     local_1e0._M_string_length);
                  local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p == paVar10) {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_158.first._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_158.first._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1e0,&local_158.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p != paVar16) {
                    operator_delete(local_158.first._M_dataplus._M_p,
                                    local_158.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != paVar14) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  p_Var7 = (local_1c0->
                           super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                }
                pMVar1 = p_Var7[local_a0]._M_current;
                p_Var3 = *(_Bit_type **)
                          &(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var3 != (((_Bit_iterator *)
                                 ((long)&(pMVar1->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar1->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0)) {
                  local_220._M_dataplus._M_p = (pointer)paVar14;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,local_198._M_dataplus._M_p,
                             local_198._M_dataplus._M_p + local_198._M_string_length);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_220,".empty() || ");
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_220,local_200._M_dataplus._M_p,
                                     local_200._M_string_length);
                  local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p == paVar10) {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_158.first._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_158.first._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_200,&local_158.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p != paVar16) {
                    operator_delete(local_158.first._M_dataplus._M_p,
                                    local_158.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != paVar14) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_d0,"!",&local_198);
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_d0,".empty() && ");
                  local_220._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p == paVar10) {
                    local_220.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_220._M_dataplus._M_p = (pointer)paVar14;
                  }
                  else {
                    local_220.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_220._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  pbVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_220,local_1e0._M_dataplus._M_p,
                                     local_1e0._M_string_length);
                  local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                  paVar10 = &pbVar6->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p == paVar10) {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                    local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                    local_158.first._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  }
                  local_158.first._M_string_length = pbVar6->_M_string_length;
                  (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
                  pbVar6->_M_string_length = 0;
                  (pbVar6->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1e0,&local_158.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158.first._M_dataplus._M_p != paVar16) {
                    operator_delete(local_158.first._M_dataplus._M_p,
                                    local_158.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != paVar14) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              std::operator+(&local_220,"      VULKAN_HPP_ASSERT( ",&local_200);
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_220," );\n");
              local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
              paVar10 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p == paVar10) {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                local_158.first._M_dataplus._M_p = (pointer)paVar16;
              }
              else {
                local_158.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              }
              local_158.first._M_string_length = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_178,local_158.first._M_dataplus._M_p,local_158.first._M_string_length
                       );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.first._M_dataplus._M_p != paVar16) {
                operator_delete(local_158.first._M_dataplus._M_p,
                                local_158.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar14) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[11],_true>(&local_158,(char (*) [11])"structName",local_a8);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (&local_118,(char (*) [11])"throwCheck",&local_1e0);
              __l._M_len = 2;
              __l._M_array = &local_158;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_60,__l,
                    (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d0,&local_d1);
              replaceWithMap(&local_220,
                             &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                              ::throwTextTemplate_abi_cxx11_,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1b8,local_220._M_dataplus._M_p,local_220._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar14) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_60);
              lVar15 = -0x80;
              paVar14 = &local_118.second.field_2;
              do {
                if (paVar14 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar14->_M_allocated_capacity)[-2]) {
                  operator_delete((long *)(&paVar14->_M_allocated_capacity)[-2],
                                  paVar14->_M_allocated_capacity + 1);
                }
                if (&paVar14->_M_allocated_capacity + -4 !=
                    (size_type *)(&paVar14->_M_allocated_capacity)[-6]) {
                  operator_delete((size_type *)(&paVar14->_M_allocated_capacity)[-6],
                                  (&paVar14->_M_allocated_capacity)[-4] + 1);
                }
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar14->_M_allocated_capacity + -8);
                lVar15 = lVar15 + 0x40;
              } while (lVar15 != 0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              uVar8 = uVar8 + 1;
              p_Var7 = (local_1c0->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              p_Var11 = (local_1c0->
                        super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            } while (uVar8 < (ulong)((long)p_Var11 - (long)p_Var7 >> 3));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
            p_Var7 = (local_1c0->
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            p_Var11 = (local_1c0->
                      super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = local_b0 + 1;
          uVar12 = local_b0;
        } while (uVar8 < (ulong)((long)p_Var11 - (long)p_Var7 >> 3));
      }
    }
    std::operator+(&local_1e0,"\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n",&local_178);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1e0,"#else\n");
    local_200._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar16 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == paVar16) {
      local_200.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    }
    else {
      local_200.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_200._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_200,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    local_240._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar16 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == paVar16) {
      local_240.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_240.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    }
    else {
      local_240.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_240._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_240,"#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n");
    local_198._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar16 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == paVar16) {
      local_198.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_198._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_198,"    ");
    paVar16 = &local_158.first.field_2;
    local_158.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar14 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.first._M_dataplus._M_p == paVar14) {
      local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_158.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_158.first._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_158.first.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_158.first._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_158.first._M_dataplus._M_p,
               local_158.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.first._M_dataplus._M_p != paVar16) {
      operator_delete(local_158.first._M_dataplus._M_p,
                      local_158.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                               local_1b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSizeCheck( std::vector<std::vector<MemberData>::const_iterator> const & arrayIts,
                                                   std::string const &                                          structName,
                                                   bool                                                         mutualExclusiveLens ) const
{
  std::string sizeCheck;
  if ( 1 < arrayIts.size() )
  {
    static const std::string throwTextTemplate = R"(      if ( ${throwCheck} )
      {
        throw LogicError( VULKAN_HPP_NAMESPACE_STRING"::${structName}::${structName}: ${throwCheck}" );
      }
)";

    std::string assertionText, throwText;
    if ( mutualExclusiveLens )
    {
      // exactly one of the arrays has to be non-empty
      std::string sum;
      for ( auto it : arrayIts )
      {
        sum += "!" + startLowerCase( stripPrefix( it->name, "p" ) ) + "_.empty() + ";
      }
      sum.resize( sum.size() - 3 );
      assertionText += "      VULKAN_HPP_ASSERT( ( " + sum + " ) <= 1);\n";
      throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", "1 < ( " + sum + " )" } } );
    }
    else
    {
      for ( size_t first = 0; first + 1 < arrayIts.size(); ++first )
      {
        assert( arrayIts[first]->name.starts_with( "p" ) );
        std::string firstName = startLowerCase( stripPrefix( arrayIts[first]->name, "p" ) ) + "_";
        for ( auto second = first + 1; second < arrayIts.size(); ++second )
        {
          assert( arrayIts[second]->name.starts_with( "p" ) );
          std::string secondName     = startLowerCase( stripPrefix( arrayIts[second]->name, "p" ) ) + "_";
          std::string assertionCheck = firstName + ".size() == " + secondName + ".size()";
          std::string throwCheck     = firstName + ".size() != " + secondName + ".size()";
          if ( ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() ) ||
               ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() ) )
          {
            assertionCheck = "( " + assertionCheck + " )";
            throwCheck     = "( " + throwCheck + " )";
            if ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() )
            {
              assertionCheck = secondName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + secondName + ".empty() && " + throwCheck;
            }
            if ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() )
            {
              assertionCheck = firstName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + firstName + ".empty() && " + throwCheck;
            }
          }
          assertionText += "      VULKAN_HPP_ASSERT( " + assertionCheck + " );\n";
          throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", throwCheck } } );
        }
      }
    }
    sizeCheck += "\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n" + assertionText + "#else\n" + throwText + "#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n" + "    ";
  }
  return sizeCheck;
}